

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_value.c
# Opt level: O0

void * metacall_value_cast_map(void **v)

{
  type_id tVar1;
  value pvVar2;
  value *ppvVar3;
  undefined8 *in_RDI;
  value unaff_retaddr;
  value v_cast;
  type_id in_stack_00000064;
  value in_stack_00000068;
  
  tVar1 = value_type_id(unaff_retaddr);
  if ((tVar1 != 10) &&
     (pvVar2 = value_type_cast(in_stack_00000068,in_stack_00000064), pvVar2 != (value)0x0)) {
    *in_RDI = pvVar2;
  }
  ppvVar3 = value_to_map((value)0x13aee6);
  return ppvVar3;
}

Assistant:

void *metacall_value_cast_map(void **v)
{
	if (value_type_id(*v) != TYPE_MAP)
	{
		value v_cast = value_type_cast(*v, TYPE_MAP);

		if (v_cast != NULL)
		{
			*v = v_cast;
		}
	}

	return value_to_map(*v);
}